

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O0

void bson_iter_document(bson_iter_t *iter,uint32_t *document_len,uint8_t **document)

{
  uint8_t **document_local;
  uint32_t *document_len_local;
  bson_iter_t *iter_local;
  
  if (iter == (bson_iter_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x6d4,"bson_iter_document","iter");
    abort();
  }
  if (document_len == (uint32_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x6d5,"bson_iter_document","document_len");
    abort();
  }
  if (document == (uint8_t **)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x6d6,"bson_iter_document","document");
    abort();
  }
  *document = (uint8_t *)0x0;
  *document_len = 0;
  if (iter->raw[iter->type] == '\x03') {
    *document_len = *(uint32_t *)(iter->raw + iter->d1);
    *document_len = *document_len;
    *document = iter->raw + iter->d1;
  }
  return;
}

Assistant:

void
bson_iter_document (const bson_iter_t *iter,  /* IN */
                    uint32_t *document_len,   /* OUT */
                    const uint8_t **document) /* OUT */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (document_len);
   BSON_ASSERT (document);

   *document = NULL;
   *document_len = 0;

   if (ITER_TYPE (iter) == BSON_TYPE_DOCUMENT) {
      memcpy (document_len, (iter->raw + iter->d1), sizeof (*document_len));
      *document_len = BSON_UINT32_FROM_LE (*document_len);
      *document = (iter->raw + iter->d1);
   }
}